

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  wchar_t wVar4;
  ImGuiWindow_conflict *pIVar5;
  ImGuiShrinkWidthItem *pIVar6;
  ImVec2 IVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  ImGuiID IVar10;
  ImGuiID IVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  ImGuiContext_conflict1 *pIVar17;
  undefined4 uVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  int section_n;
  ImGuiID IVar22;
  int iVar23;
  ImGuiTabItem *pIVar24;
  char *pcVar25;
  ImGuiShrinkWidthItem *__dest;
  char *__dest_00;
  long lVar26;
  ImGuiTabItem *pIVar27;
  long lVar28;
  ImGuiID IVar29;
  ImGuiID *pIVar30;
  int iVar31;
  uint uVar32;
  ImGuiTabItem *pIVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  byte bVar37;
  uint uVar38;
  ImGuiContext_conflict1 *pIVar39;
  int iVar40;
  long lVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  float local_110;
  undefined8 local_100;
  float local_f8 [3];
  uint uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  int local_9c [2];
  float local_94;
  ImVec2 local_90;
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  ImVec4 local_78;
  undefined8 local_60;
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  pIVar39 = GImGui;
  tab_bar->WantLayout = false;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  stack0xffffffffffffff10 = 0;
  local_d8 = 0;
  uVar38 = (tab_bar->Tabs).Size;
  if ((int)uVar38 < 1) {
    bVar37 = 0;
    uVar42 = 0;
  }
  else {
    pIVar33 = (tab_bar->Tabs).Data;
    lVar26 = 0;
    uVar34 = 0;
    uVar42 = 0;
    bVar37 = 0;
    do {
      pIVar30 = (ImGuiID *)((long)&pIVar33->ID + lVar26);
      if ((*(int *)((long)&pIVar33->LastFrameVisible + lVar26) < tab_bar->PrevFrameVisible) ||
         ((&pIVar33->WantClose)[lVar26] == true)) {
        IVar29 = *pIVar30;
        if (tab_bar->VisibleTabId == IVar29) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == IVar29) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == IVar29) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        uVar36 = (ulong)uVar42;
        if (uVar34 != uVar36) {
          if (((int)uVar42 < 0) || ((int)uVar38 <= (int)uVar42)) goto LAB_001f28bc;
          IVar29 = *pIVar30;
          IVar22 = pIVar30[1];
          IVar8 = pIVar30[2];
          IVar9 = pIVar30[3];
          IVar10 = pIVar30[4];
          IVar11 = pIVar30[5];
          fVar43 = (float)pIVar30[6];
          fVar46 = (float)pIVar30[7];
          *(undefined1 (*) [16])((long)&pIVar33[uVar36].Width + 1) =
               *(undefined1 (*) [16])((long)pIVar30 + 0x1d);
          piVar1 = &pIVar33[uVar36].LastFrameVisible;
          *piVar1 = IVar10;
          piVar1[1] = IVar11;
          piVar1[2] = (int)fVar43;
          piVar1[3] = (int)fVar46;
          pIVar33 = pIVar33 + uVar36;
          pIVar33->ID = IVar29;
          pIVar33->Flags = IVar22;
          *(ImGuiID *)&pIVar33->Window = IVar8;
          *(ImGuiID *)((long)&pIVar33->Window + 4) = IVar9;
          uVar38 = (tab_bar->Tabs).Size;
        }
        if ((int)uVar38 <= (int)uVar42) goto LAB_001f28bc;
        pIVar33 = (tab_bar->Tabs).Data;
        pIVar33[uVar36].IndexDuringLayout = (ImS16)uVar42;
        uVar35 = pIVar33[uVar36].Flags;
        lVar41 = 0;
        if ((uVar35 & 0x40) == 0) {
          lVar41 = (ulong)((char)(byte)uVar35 < '\0') + 1;
        }
        if (uVar42 != 0) {
          if ((int)uVar38 < (int)uVar42) goto LAB_001f28bc;
          bVar37 = (pIVar33[(long)(int)uVar42 + -1].Flags & 0x40U) == 0 & (byte)uVar35 >> 6 | bVar37
                   | ((uVar35 & 0xc0) != 0x80 &&
                     (pIVar33[(long)(int)uVar42 + -1].Flags & 0xc0U) == 0x80);
        }
        local_f8[lVar41 * 3] = (float)((int)local_f8[lVar41 * 3] + 1);
        uVar42 = uVar42 + 1;
      }
      uVar34 = uVar34 + 1;
      lVar26 = lVar26 + 0x30;
    } while ((long)uVar34 < (long)(int)uVar38);
  }
  if (uVar38 != uVar42) {
    iVar31 = (tab_bar->Tabs).Capacity;
    if (iVar31 < (int)uVar42) {
      if (iVar31 == 0) {
        uVar38 = 8;
      }
      else {
        uVar38 = iVar31 / 2 + iVar31;
      }
      if ((int)uVar38 <= (int)uVar42) {
        uVar38 = uVar42;
      }
      pIVar24 = (ImGuiTabItem *)MemAlloc((long)(int)uVar38 * 0x30);
      pIVar33 = (tab_bar->Tabs).Data;
      if (pIVar33 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar24,pIVar33,(long)(tab_bar->Tabs).Size * 0x30);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar24;
      (tab_bar->Tabs).Capacity = uVar38;
    }
    (tab_bar->Tabs).Size = uVar42;
  }
  if (bVar37 != 0) {
    qsort((tab_bar->Tabs).Data,(long)(int)uVar42,0x30,TabItemComparerBySection);
  }
  fVar46 = local_f8[0];
  uVar38 = uStack_ec;
  iVar31 = (int)uStack_e0;
  fVar43 = 0.0;
  local_110 = 0.0;
  if (0 < (int)((int)uStack_e0 + uStack_ec) && 0 < (int)local_f8[0]) {
    fVar43 = (pIVar39->Style).ItemInnerSpacing.x;
  }
  stack0xffffffffffffff10 = CONCAT44(uStack_ec,fVar43);
  if (0 < (int)uStack_e0 && 0 < (int)uStack_ec) {
    local_110 = (pIVar39->Style).ItemInnerSpacing.x;
  }
  local_e8 = CONCAT44(local_110,(float)local_e8);
  IVar29 = tab_bar->NextSelectedTabId;
  if (IVar29 != 0) {
    tab_bar->SelectedTabId = IVar29;
    tab_bar->NextSelectedTabId = 0;
  }
  local_100 = pIVar39;
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar19 = TabBarProcessReorder(tab_bar);
    if ((bVar19) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      IVar29 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar39 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar5 = GImGui->CurrentWindow;
    fVar44 = (GImGui->Style).FramePadding.y;
    fVar47 = GImGui->FontSize;
    local_c8._0_4_ = (pIVar5->DC).CursorPos.x;
    local_c8._4_4_ = (pIVar5->DC).CursorPos.y;
    fVar45 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar44;
    (pIVar5->DC).CursorPos.y = fVar45;
    (tab_bar->BarRect).Min.x = fVar47 + fVar44 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar39->Style).Colors[0].x;
    local_58.y = (pIVar39->Style).Colors[0].y;
    uVar12 = (pIVar39->Style).Colors[0].z;
    uVar13 = (pIVar39->Style).Colors[0].w;
    local_58.w = (float)uVar13 * 0.5;
    local_58.z = (float)uVar12;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    bVar19 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar19) {
      iVar40 = (tab_bar->Tabs).Size;
      if (0 < iVar40) {
        local_b8._0_8_ = pIVar5;
        lVar26 = 0;
        lVar41 = 0;
        pIVar33 = (ImGuiTabItem *)0x0;
        do {
          pIVar24 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar24->Flags + lVar26 + 2) & 0x20) == 0) {
            pIVar24 = (ImGuiTabItem *)((long)&pIVar24->ID + lVar26);
            pcVar25 = ImGuiTabBar::GetTabName(tab_bar,pIVar24);
            local_78.x = 0.0;
            local_78.y = 0.0;
            bVar19 = Selectable(pcVar25,tab_bar->SelectedTabId == pIVar24->ID,0,(ImVec2 *)&local_78)
            ;
            if (bVar19) {
              pIVar33 = pIVar24;
            }
            iVar40 = (tab_bar->Tabs).Size;
          }
          lVar41 = lVar41 + 1;
          lVar26 = lVar26 + 0x30;
        } while (lVar41 < iVar40);
        EndPopup();
        *(undefined8 *)(local_b8._0_8_ + 0x110) = local_c8._0_8_;
        if (pIVar33 != (ImGuiTabItem *)0x0) {
          IVar29 = pIVar33->ID;
          tab_bar->SelectedTabId = IVar29;
        }
        goto LAB_001f1dc4;
      }
      EndPopup();
    }
    auVar51 = local_c8;
    (pIVar5->DC).CursorPos.x = (float)local_c8._0_4_;
    (pIVar5->DC).CursorPos.y = (float)local_c8._4_4_;
    local_c8 = auVar51;
  }
LAB_001f1dc4:
  pIVar39 = local_100;
  local_9c[0] = 0;
  local_9c[1] = iVar31 + (int)fVar46;
  local_94 = fVar46;
  iVar31 = (tab_bar->Tabs).Size;
  iVar40 = (local_100->ShrinkWidthBuffer).Capacity;
  iVar23 = iVar31;
  if (iVar40 < iVar31) {
    if (iVar40 == 0) {
      iVar40 = 8;
    }
    else {
      iVar40 = iVar40 / 2 + iVar40;
    }
    if (iVar40 <= iVar31) {
      iVar40 = iVar31;
    }
    __dest = (ImGuiShrinkWidthItem *)MemAlloc((long)iVar40 << 3);
    pIVar6 = (pIVar39->ShrinkWidthBuffer).Data;
    if (pIVar6 != (ImGuiShrinkWidthItem *)0x0) {
      memcpy(__dest,pIVar6,(long)(pIVar39->ShrinkWidthBuffer).Size << 3);
      MemFree((pIVar39->ShrinkWidthBuffer).Data);
    }
    (pIVar39->ShrinkWidthBuffer).Data = __dest;
    (pIVar39->ShrinkWidthBuffer).Capacity = iVar40;
    iVar23 = (tab_bar->Tabs).Size;
  }
  (pIVar39->ShrinkWidthBuffer).Size = iVar31;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_b8._8_8_;
  local_b8 = auVar51 << 0x40;
  if (iVar23 < 1) {
    bVar19 = true;
    pIVar30 = (ImGuiID *)0x0;
  }
  else {
    lVar41 = 0;
    lVar26 = 0;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_c8._8_8_;
    local_c8 = auVar16 << 0x40;
    bVar19 = false;
    iVar31 = -1;
    do {
      pIVar33 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar33->LastFrameVisible + lVar41) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                      ,0x1ce0,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      pIVar24 = (ImGuiTabItem *)((long)&pIVar33->ID + lVar41);
      if (((ImGuiTabItem *)local_c8._0_8_ == (ImGuiTabItem *)0x0) ||
         (*(int *)(local_c8._0_8_ + 0x14) < *(int *)((long)&pIVar33->LastFrameSelected + lVar41))) {
        pIVar27 = (ImGuiTabItem *)local_c8._0_8_;
        if ((*(byte *)((long)&pIVar33->Flags + lVar41 + 2) & 0x20) == 0) {
          pIVar27 = pIVar24;
        }
        local_c8._0_8_ = pIVar27;
      }
      IVar22 = pIVar24->ID;
      if (IVar22 == tab_bar->SelectedTabId) {
        bVar19 = true;
      }
      if ((IVar29 == 0) && (IVar29 = IVar22, local_100->NavJustMovedToId != IVar22)) {
        IVar29 = 0;
      }
      pcVar25 = ImGuiTabBar::GetTabName(tab_bar,pIVar24);
      IVar7 = TabItemCalcSize(pcVar25,(*(uint *)((long)&pIVar33->Flags + lVar41) >> 0x14 & 1) == 0);
      auVar51 = local_b8;
      fVar44 = IVar7.x;
      *(float *)((long)&pIVar33->ContentWidth + lVar41) = fVar44;
      uVar42 = *(uint *)((long)&pIVar33->Flags + lVar41);
      uVar34 = (ulong)(((char)uVar42 < '\0') + 1);
      if ((uVar42 & 0x40) != 0) {
        uVar34 = 0;
      }
      fVar47 = 0.0;
      if ((int)uVar34 == iVar31) {
        fVar47 = (local_100->Style).ItemInnerSpacing.x;
      }
      local_f8[uVar34 * 3 + 1] = fVar47 + fVar44 + local_f8[uVar34 * 3 + 1];
      iVar31 = local_9c[uVar34];
      lVar28 = (long)iVar31;
      local_9c[uVar34] = iVar31 + 1;
      if ((lVar28 < 0) || ((local_100->ShrinkWidthBuffer).Size <= iVar31)) goto LAB_001f28db;
      pIVar6 = (local_100->ShrinkWidthBuffer).Data;
      pIVar6[lVar28].Index = (wchar_t)lVar26;
      if ((local_100->ShrinkWidthBuffer).Size <= iVar31) goto LAB_001f28db;
      pIVar6[lVar28].Width = fVar44;
      if (fVar44 <= 0.0) {
        __assert_fail("tab->ContentWidth > 0.0f",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                      ,0x1cfb,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      *(float *)((long)&pIVar33->Width + lVar41) = fVar44;
      lVar26 = lVar26 + 1;
      iVar40 = (tab_bar->Tabs).Size;
      lVar41 = lVar41 + 0x30;
      iVar31 = (int)uVar34;
    } while (lVar26 < iVar40);
    local_b8._1_7_ = 0;
    local_b8[0] = 1 < iVar40;
    local_b8._8_8_ = auVar51._8_8_;
    bVar19 = !bVar19;
    pIVar30 = (ImGuiID *)local_c8._0_8_;
    pIVar39 = local_100;
  }
  fVar44 = 0.0;
  lVar26 = 8;
  do {
    fVar44 = fVar44 + *(float *)((long)&local_100 + lVar26 + 4) +
                      *(float *)((long)local_f8 + lVar26);
    lVar26 = lVar26 + 0xc;
  } while (lVar26 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar44;
  pIVar17 = GImGui;
  fVar47 = (tab_bar->BarRect).Max.x;
  if (((local_b8[0] & fVar47 - (tab_bar->BarRect).Min.x < fVar44) != 0) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar5 = GImGui->CurrentWindow;
    fVar47 = GImGui->FontSize + -2.0;
    local_c8 = ZEXT416((uint)fVar47);
    fVar44 = (GImGui->Style).FramePadding.y;
    _local_88 = ZEXT416((uint)(fVar44 + fVar44 + GImGui->FontSize));
    local_b8 = ZEXT416((uint)(fVar47 + fVar47));
    local_90 = (pIVar5->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar14 = (GImGui->Style).Colors[0].z;
    uVar15 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar15 * 0.5;
    local_58.z = (float)uVar14;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    local_60._0_4_ = (pIVar17->IO).KeyRepeatDelay;
    local_60._4_4_ = (pIVar17->IO).KeyRepeatRate;
    (pIVar17->IO).KeyRepeatDelay = 0.25;
    (pIVar17->IO).KeyRepeatRate = 0.2;
    fVar44 = (tab_bar->BarRect).Min.x;
    fVar47 = (tab_bar->BarRect).Max.x - (float)local_b8._0_4_;
    uVar42 = -(uint)(fVar47 <= fVar44);
    fVar47 = (float)(uVar42 & (uint)fVar44 | ~uVar42 & (uint)fVar47);
    local_48 = ZEXT416((uint)fVar47);
    fVar44 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = fVar47;
    (pIVar5->DC).CursorPos.y = fVar44;
    uVar18 = local_88._0_4_;
    uStack_7c = local_88._4_4_;
    local_88._4_4_ = local_88._0_4_;
    local_88._0_4_ = local_c8._0_4_;
    uStack_80 = local_c8._4_4_;
    IVar7.y = (float)uVar18;
    IVar7.x = (float)local_c8._0_4_;
    bVar20 = ArrowButtonEx("##<",0,IVar7,0x410);
    fVar44 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = (float)local_48._0_4_ + (float)local_c8._0_4_;
    (pIVar5->DC).CursorPos.y = fVar44;
    bVar21 = ArrowButtonEx("##>",1,(ImVec2)local_88,0x410);
    iVar31 = -(uint)bVar20;
    if (bVar21) {
      iVar31 = 1;
    }
    PopStyleColor(2);
    (pIVar17->IO).KeyRepeatDelay = (float)(undefined4)local_60;
    (pIVar17->IO).KeyRepeatRate = (float)local_60._4_4_;
    if (((iVar31 != 0) && (tab_bar->SelectedTabId != 0)) &&
       (lVar26 = (long)(tab_bar->Tabs).Size, 0 < lVar26)) {
      pIVar33 = (tab_bar->Tabs).Data;
      do {
        if (pIVar33->ID == tab_bar->SelectedTabId) {
          uVar42 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar33);
          iVar40 = (tab_bar->Tabs).Size;
          goto LAB_001f283d;
        }
        pIVar33 = pIVar33 + 1;
        lVar26 = lVar26 + -1;
      } while (lVar26 != 0);
    }
    (pIVar5->DC).CursorPos = local_90;
    fVar47 = (tab_bar->BarRect).Max.x - ((float)local_b8._0_4_ + 1.0);
    (tab_bar->BarRect).Max.x = fVar47;
    pIVar39 = local_100;
  }
  goto LAB_001f2271;
LAB_001f28db:
  pcVar25 = "T &ImVector<ImGuiShrinkWidthItem>::operator[](int) [T = ImGuiShrinkWidthItem]";
  goto LAB_001f28d1;
LAB_001f28bc:
  pcVar25 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_001f28d1:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x706,pcVar25);
  while( true ) {
    pIVar33 = (tab_bar->Tabs).Data;
    if (((pIVar33[uVar35].Flags & 0x200000) == 0) ||
       ((iVar23 = uVar42 + iVar31 * 2, iVar23 < 0 || (uVar42 = uVar32, iVar40 <= iVar23)))) break;
LAB_001f283d:
    uVar32 = iVar31 + uVar42;
    uVar35 = uVar42;
    if ((int)uVar32 < iVar40) {
      uVar35 = uVar32;
    }
    if ((int)uVar32 < 0) {
      uVar35 = uVar42;
    }
    if (((int)uVar35 < 0) || (iVar40 <= (int)uVar35)) goto LAB_001f28bc;
  }
  pIVar33 = pIVar33 + uVar35;
  (pIVar5->DC).CursorPos = local_90;
  fVar47 = (tab_bar->BarRect).Max.x - ((float)local_b8._0_4_ + 1.0);
  (tab_bar->BarRect).Max.x = fVar47;
  IVar29 = pIVar33->ID;
  pIVar39 = local_100;
  if ((pIVar33->Flags & 0x200000) == 0) {
    tab_bar->SelectedTabId = IVar29;
  }
LAB_001f2271:
  fVar44 = local_f8[1] + fVar43 + uStack_e0._4_4_ + 0.0;
  fVar47 = fVar47 - (tab_bar->BarRect).Min.x;
  if (fVar44 < fVar47) {
    fVar45 = ((float)local_e8 + local_110) -
             ((fVar47 - (local_f8[1] + fVar43)) - (uStack_e0._4_4_ + 0.0));
    if (0.0 <= fVar45) goto LAB_001f22c9;
  }
  else {
    fVar45 = fVar44 - fVar47;
LAB_001f22c9:
    if ((0.0 < fVar45) && ((fVar47 <= fVar44 || ((tab_bar->Flags & 0x40U) != 0)))) {
      if (fVar47 <= fVar44) {
        uVar38 = (int)uStack_e0 + (int)fVar46;
      }
      uVar42 = 0;
      if (fVar44 < fVar47) {
        uVar42 = (int)uStack_e0 + (int)fVar46;
      }
      ShrinkWidths((ImGuiShrinkWidthItem_conflict *)
                   ((pIVar39->ShrinkWidthBuffer).Data + (int)uVar42),uVar38,fVar45);
      if (0 < (int)uVar38) {
        uVar34 = (ulong)uVar42;
        do {
          if (((int)uVar42 < 0) || ((pIVar39->ShrinkWidthBuffer).Size <= (int)uVar34))
          goto LAB_001f28db;
          pIVar6 = (pIVar39->ShrinkWidthBuffer).Data;
          wVar4 = pIVar6[uVar34].Index;
          lVar26 = (long)wVar4;
          if ((lVar26 < 0) || ((tab_bar->Tabs).Size <= wVar4)) goto LAB_001f28bc;
          iVar31 = (int)pIVar6[uVar34].Width;
          if (-1 < iVar31) {
            pIVar33 = (tab_bar->Tabs).Data;
            fVar44 = (float)iVar31;
            lVar41 = (ulong)((char)pIVar33[lVar26].Flags < '\0') + 1;
            if ((pIVar33[lVar26].Flags & 0x40U) != 0) {
              lVar41 = 0;
            }
            local_f8[lVar41 * 3 + 1] = local_f8[lVar41 * 3 + 1] - (pIVar33[lVar26].Width - fVar44);
            pIVar33[lVar26].Width = fVar44;
          }
          uVar34 = uVar34 + 1;
        } while ((int)uVar34 < (int)(uVar38 + uVar42));
      }
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  lVar26 = 0;
  fVar47 = 0.0;
  fVar44 = 0.0;
  uVar38 = 0;
  do {
    fVar45 = fVar44;
    if ((lVar26 == 2) &&
       (fVar45 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_f8[7],
       fVar45 = (float)(~-(uint)(fVar45 <= 0.0) & (uint)fVar45), fVar44 <= fVar45)) {
      fVar45 = fVar44;
    }
    fVar48 = local_f8[lVar26 * 3];
    if (0 < (long)(int)fVar48) {
      lVar41 = (ulong)uVar38 * 0x30;
      uVar34 = 0;
      do {
        if (((int)uVar38 < 0) || ((tab_bar->Tabs).Size <= (int)(uVar38 + (int)uVar34)))
        goto LAB_001f28bc;
        pIVar33 = (tab_bar->Tabs).Data;
        *(float *)((long)&pIVar33->Offset + lVar41) = fVar45;
        *(undefined4 *)((long)&pIVar33->NameOffset + lVar41) = 0xffffffff;
        fVar44 = 0.0;
        if (uVar34 < (int)fVar48 - 1) {
          fVar44 = (pIVar39->Style).ItemInnerSpacing.x;
        }
        fVar45 = fVar45 + fVar44 + *(float *)((long)&pIVar33->Width + lVar41);
        uVar34 = uVar34 + 1;
        lVar41 = lVar41 + 0x30;
      } while ((long)(int)fVar48 != uVar34);
    }
    fVar44 = local_f8[lVar26 * 3 + 2];
    fVar52 = local_f8[lVar26 * 3 + 1] + fVar44;
    fVar47 = fVar47 + (float)(-(uint)(0.0 <= fVar52) & (uint)fVar52);
    tab_bar->WidthAllTabs = fVar47;
    fVar44 = fVar45 + fVar44;
    uVar38 = (int)fVar48 + uVar38;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 3);
  if ((tab_bar->TabsNames).Buf.Capacity < 0) {
    __dest_00 = (char *)MemAlloc(0);
    pcVar25 = (tab_bar->TabsNames).Buf.Data;
    if (pcVar25 != (char *)0x0) {
      memcpy(__dest_00,pcVar25,(long)(tab_bar->TabsNames).Buf.Size);
      MemFree((tab_bar->TabsNames).Buf.Data);
    }
    (tab_bar->TabsNames).Buf.Data = __dest_00;
    (tab_bar->TabsNames).Buf.Capacity = 0;
  }
  (tab_bar->TabsNames).Buf.Size = 0;
  if (bVar19) {
    tab_bar->SelectedTabId = 0;
  }
  else {
    IVar22 = tab_bar->SelectedTabId;
    if (IVar22 != 0) goto LAB_001f2525;
  }
  IVar22 = 0;
  if ((tab_bar->NextSelectedTabId == 0) && (IVar22 = 0, pIVar30 != (ImGuiID *)0x0)) {
    IVar22 = *pIVar30;
    tab_bar->SelectedTabId = IVar22;
    IVar29 = IVar22;
  }
LAB_001f2525:
  tab_bar->VisibleTabId = IVar22;
  tab_bar->VisibleTabWasSubmitted = false;
  pIVar5 = pIVar39->NavWindowingTarget;
  if (((pIVar5 != (ImGuiWindow_conflict *)0x0) && (pIVar5->DockNode != (ImGuiDockNode *)0x0)) &&
     (pIVar5->DockNode->TabBar == tab_bar)) {
    IVar29 = pIVar5->ID;
    tab_bar->VisibleTabId = IVar29;
  }
  if ((IVar29 != 0) && (lVar26 = (long)(tab_bar->Tabs).Size, 0 < lVar26)) {
    pIVar33 = (tab_bar->Tabs).Data;
    do {
      if (pIVar33->ID == IVar29) {
        if ((pIVar33->Flags & 0xc0) != 0) break;
        fVar44 = GImGui->FontSize;
        iVar31 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar33);
        fVar47 = (tab_bar->BarRect).Max.x;
        fVar45 = (tab_bar->BarRect).Min.x;
        fVar52 = pIVar33->Offset - local_f8[1];
        fVar48 = fVar44;
        if (iVar31 < (int)fVar46) {
          fVar48 = -0.0;
        }
        fVar48 = fVar52 - fVar48;
        if ((tab_bar->Tabs).Size - (int)uStack_e0 <= iVar31 + 1) {
          fVar44 = 1.0;
        }
        fVar44 = fVar52 + pIVar33->Width + fVar44;
        tab_bar->ScrollingTargetDistToVisibility = 0.0;
        if ((fVar48 < tab_bar->ScrollingTarget) ||
           (fVar46 = (((fVar47 - fVar45) - local_f8[1]) - uStack_e0._4_4_) - local_110,
           fVar46 <= fVar44 - fVar48)) {
          fVar47 = tab_bar->ScrollingAnim - fVar44;
        }
        else {
          if (fVar44 - fVar46 <= tab_bar->ScrollingTarget) break;
          fVar47 = (fVar48 - fVar46) - tab_bar->ScrollingAnim;
          fVar48 = fVar44 - fVar46;
        }
        tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
        tab_bar->ScrollingTarget = fVar48;
        break;
      }
      pIVar33 = pIVar33 + 1;
      lVar26 = lVar26 + -1;
    } while (lVar26 != 0);
  }
  fVar46 = (tab_bar->BarRect).Min.x;
  fVar44 = (tab_bar->BarRect).Max.x;
  auVar49._0_4_ = tab_bar->WidthAllTabs - (fVar44 - fVar46);
  uVar2 = tab_bar->ScrollingAnim;
  uVar3 = tab_bar->ScrollingTarget;
  auVar50._4_4_ = uVar3;
  auVar50._0_4_ = uVar2;
  auVar50._8_8_ = 0;
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  auVar51 = minps(auVar50,auVar49);
  fVar47 = (float)(-(uint)(0.0 <= auVar51._0_4_) & (uint)auVar51._0_4_);
  fVar45 = (float)(-(uint)(0.0 <= auVar51._4_4_) & (uint)auVar51._4_4_);
  tab_bar->ScrollingAnim = fVar47;
  tab_bar->ScrollingTarget = fVar45;
  if ((fVar47 != fVar45) || (NAN(fVar47) || NAN(fVar45))) {
    fVar48 = pIVar39->FontSize;
    fVar52 = fVar48 * 70.0;
    uVar38 = -(uint)(fVar52 <= tab_bar->ScrollingSpeed);
    fVar53 = ABS(fVar45 - fVar47) / 0.3;
    fVar52 = (float)(~uVar38 & (uint)fVar52 | (uint)tab_bar->ScrollingSpeed & uVar38);
    uVar38 = -(uint)(fVar53 <= fVar52);
    fVar53 = (float)(~uVar38 & (uint)fVar53 | uVar38 & (uint)fVar52);
    tab_bar->ScrollingSpeed = fVar53;
    fVar52 = fVar45;
    if ((pIVar39->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar48 * 10.0)) {
      fVar53 = fVar53 * (pIVar39->IO).DeltaTime;
      if (fVar45 <= fVar47) {
        fVar52 = fVar47;
        if (fVar45 < fVar47) {
          fVar47 = fVar47 - fVar53;
          uVar38 = -(uint)(fVar45 <= fVar47);
          fVar52 = (float)((uint)fVar47 & uVar38 | ~uVar38 & (uint)fVar45);
        }
      }
      else {
        fVar52 = fVar47 + fVar53;
        if (fVar45 <= fVar52) {
          fVar52 = fVar45;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar52;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = fVar43 + fVar46 + local_f8[1];
  tab_bar->ScrollingRectMaxX = (fVar44 - uStack_e0._4_4_) - local_110;
  pIVar5 = pIVar39->CurrentWindow;
  (pIVar5->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabs;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  fVar46 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar43 = (pIVar5->DC).IdealMaxPos.x;
  uVar38 = -(uint)(fVar46 <= fVar43);
  (pIVar5->DC).IdealMaxPos.x = (float)(uVar38 & (uint)fVar43 | ~uVar38 & (uint)fVar46);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = TabItemGetSectionIdx(tab);
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = TabItemGetSectionIdx(prev_tab);
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_to_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_to_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_to_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_to_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_to_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_to_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = TabItemGetSectionIdx(tab);
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        IM_MSVC_WARNING_SUPPRESS(6385);
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_and_select_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_to_tab_id = scroll_and_select_tab->ID;
            if ((scroll_and_select_tab->Flags & ImGuiTabItemFlags_Button) == 0)
                tab_bar->SelectedTabId = scroll_to_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = TabItemGetSectionIdx(tab);
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab->NameOffset = -1;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // Clear name buffers
    tab_bar->TabsNames.Buf.resize(0);

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_to_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // CTRL+TAB can override visible tab temporarily
    if (g.NavWindowingTarget != NULL && g.NavWindowingTarget->DockNode && g.NavWindowingTarget->DockNode->TabBar == tab_bar)
        tab_bar->VisibleTabId = scroll_to_tab_id = g.NavWindowingTarget->ID;

    // Update scrolling
    if (scroll_to_tab_id != 0)
        TabBarScrollToTab(tab_bar, scroll_to_tab_id, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabs, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}